

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  ImGuiScrollFlags scroll_flags_00;
  ImGuiDir clip_dir;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  int offset_local;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if (offset < -1) {
    __assert_fail("offset >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1ce6,"void ImGui::SetKeyboardFocusHere(int)");
  }
  if ((GImGui->DebugLogFlags & 1U) != 0) {
    DebugLog("SetKeyboardFocusHere(%d) in window \"%s\"\n",(ulong)(uint)offset,window_00->Name);
  }
  if (((pIVar1->DragDropActive & 1U) == 0) && (pIVar1->MovingWindow == (ImGuiWindow *)0x0)) {
    SetNavWindow(window_00);
    scroll_flags_00 = 3;
    if ((window_00->Appearing & 1U) != 0) {
      scroll_flags_00 = 0x21;
    }
    clip_dir = 3;
    if (offset < 0) {
      clip_dir = 2;
    }
    NavMoveRequestSubmit(-1,clip_dir,0x600,scroll_flags_00);
    if (offset == -1) {
      NavMoveRequestResolveWithLastItem(&pIVar1->NavMoveResultLocal);
    }
    else {
      pIVar1->NavTabbingDir = 1;
      pIVar1->NavTabbingCounter = offset + 1;
    }
  }
  else if ((pIVar1->DebugLogFlags & 1U) != 0) {
    DebugLog("SetKeyboardFocusHere() ignored while DragDropActive!\n");
  }
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    IMGUI_DEBUG_LOG_ACTIVEID("SetKeyboardFocusHere(%d) in window \"%s\"\n", offset, window->Name);

    // It makes sense in the vast majority of cases to never interrupt a drag and drop.
    // When we refactor this function into ActivateItem() we may want to make this an option.
    // MovingWindow is protected from most user inputs using SetActiveIdUsingNavAndKeys(), but
    // is also automatically dropped in the event g.ActiveId is stolen.
    if (g.DragDropActive || g.MovingWindow != NULL)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetKeyboardFocusHere() ignored while DragDropActive!\n");
        return;
    }

    SetNavWindow(window);

    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, offset < 0 ? ImGuiDir_Up : ImGuiDir_Down, ImGuiNavMoveFlags_Tabbing | ImGuiNavMoveFlags_FocusApi, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
    {
        NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
    }
    else
    {
        g.NavTabbingDir = 1;
        g.NavTabbingCounter = offset + 1;
    }
}